

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint __thiscall
ON_SubDMeshFragmentIterator::GetFragmentCounts
          (ON_SubDMeshFragmentIterator *this,uint *full_size_fragment_count,
          uint *half_size_fragment_count)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = FragmentCount(this);
  if (uVar1 == 0) {
    *full_size_fragment_count = 0;
    uVar2 = 0;
  }
  else {
    *full_size_fragment_count = this->m_full_size_fragment_count;
    uVar2 = this->m_half_size_fragment_count;
  }
  *half_size_fragment_count = uVar2;
  return uVar1;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::GetFragmentCounts(
    unsigned int& full_size_fragment_count,
    unsigned int& half_size_fragment_count
  ) const
{
  unsigned int fragment_count = FragmentCount();

  if (fragment_count > 0)
  {
    full_size_fragment_count = m_full_size_fragment_count;
    half_size_fragment_count = m_half_size_fragment_count;
  }
  else
  {
    full_size_fragment_count = 0;
    half_size_fragment_count = 0;
  }
  return fragment_count;
}